

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

IterateResult __thiscall glcts::ViewportArray::DrawTestBase::iterate(DrawTestBase *this)

{
  int iVar1;
  uint uVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TestError *this_00;
  char *description;
  char *__filename;
  pointer_____offset_0x10___ *ppuVar5;
  ulong uVar6;
  bool is_clear;
  uint local_310;
  uint local_30c;
  uint local_308;
  uint local_304;
  uint local_300;
  GLfloat depth_value;
  framebuffer framebuffer;
  string result;
  vertexArray vao;
  GLchar *vert_template;
  GLchar *geom_template;
  texture texture_1;
  string vertex;
  string geometry;
  string fragment;
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  program program;
  GLchar *frag_template;
  size_type __dnew;
  GLuint GStack_1b0;
  GLuint GStack_1ac;
  Context *local_1a8;
  bool local_1a0;
  long lVar4;
  
  if ((this->super_TestCaseBase).m_is_viewport_array_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Viewport array functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0x9dd);
    ppuVar5 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar1);
    local_30c = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    uVar2 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])(this);
    local_308 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[7])(this);
    if (uVar2 < 4) {
      local_304 = *(uint *)(&DAT_01b84460 + (ulong)uVar2 * 4);
      (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])(local_208,this);
      (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[9])(local_228,this);
      result._M_dataplus._M_p = (pointer)&result.field_2;
      __dnew = 0x2e;
      result._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&result,(ulong)&__dnew);
      result.field_2._M_allocated_capacity = __dnew;
      builtin_strncpy(result._M_dataplus._M_p,
                      "${VERSION}\n\nvoid main()\n{\n    /* empty */;\n}\n\n",0x2e);
      result._M_string_length = __dnew;
      result._M_dataplus._M_p[__dnew] = '\0';
      frag_template = (GLchar *)local_208[0];
      geom_template = (GLchar *)local_228[0];
      vert_template = result._M_dataplus._M_p;
      TestCaseBase::specializeShader_abi_cxx11_
                (&fragment,&this->super_TestCaseBase,1,&frag_template);
      TestCaseBase::specializeShader_abi_cxx11_
                (&geometry,&this->super_TestCaseBase,1,&geom_template);
      TestCaseBase::specializeShader_abi_cxx11_(&vertex,&this->super_TestCaseBase,1,&vert_template);
      program.m_context = (this->super_TestCaseBase).m_context;
      program.m_tesselation_control_shader_id = 0;
      program.m_tesselation_evaluation_shader_id = 0;
      program.m_vertex_shader_id = 0;
      program.m_compute_shader_id = 0;
      program.m_fragment_shader_id = 0;
      program.m_geometry_shader_id = 0;
      program.m_program_object_id = 0;
      Utils::program::build
                (&program,(GLchar *)0x0,fragment._M_dataplus._M_p,geometry._M_dataplus._M_p,
                 (GLchar *)0x0,(GLchar *)0x0,vertex._M_dataplus._M_p,(GLchar **)0x0,0,false);
      iVar1 = (*(program.m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x1680))(program.m_program_object_id);
      dVar3 = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
      glu::checkError(dVar3,"UseProgram",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x295);
      vao.m_context = (this->super_TestCaseBase).m_context;
      vao.m_id = 0;
      local_300 = uVar2;
      Utils::vertexArray::generate(&vao);
      iVar1 = (*(vao.m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0xd8))(vao.m_id);
      dVar3 = (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0x800))();
      glu::checkError(dVar3,"BindVertexArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x3b2);
      local_30c = local_30c & 0x300;
      local_310 = 0;
      do {
        texture_1.m_context = (this->super_TestCaseBase).m_context;
        __dnew = 0;
        GStack_1b0 = 0;
        GStack_1ac = 0;
        local_1a0 = false;
        texture_1.m_id = 0;
        texture_1.m_width = 0;
        texture_1.m_height = 0;
        texture_1.m_depth = 0;
        texture_1.m_is_array = false;
        local_1a8 = texture_1.m_context;
        (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xc])
                  (this,(texture *)&__dnew,&texture_1);
        framebuffer.m_context = (this->super_TestCaseBase).m_context;
        framebuffer.m_id = 0;
        Utils::framebuffer::generate(&framebuffer);
        (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xe])
                  (this,&framebuffer,(texture *)&__dnew,&texture_1);
        iVar1 = (*(framebuffer.m_context)->m_renderCtx->_vptr_RenderContext[3])();
        (**(code **)(CONCAT44(extraout_var_02,iVar1) + 0x78))(0x8ca9,framebuffer.m_id);
        dVar3 = (**(code **)(CONCAT44(extraout_var_02,iVar1) + 0x800))();
        glu::checkError(dVar3,"BindFramebuffer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                        ,0xd6);
        (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xf])
                  (this,(ulong)local_300,(ulong)local_310);
        iVar1 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
                          (this);
        if ((char)iVar1 == '\0') {
          if (local_308 != 0) {
            uVar6 = 0;
            do {
              (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xd])
                        (this,&program,uVar6);
              (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])
                        (this,&is_clear,uVar6,&depth_value);
              if (is_clear == true) {
                if (local_30c == 0x100) {
                  (**(code **)(lVar4 + 0x1c8))(SUB84((double)depth_value,0));
                }
                else {
                  (**(code **)(lVar4 + 0x1d0))();
                }
                dVar3 = (**(code **)(lVar4 + 0x800))();
                glu::checkError(dVar3,"ClearDepth",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                                ,0xa53);
                (**(code **)(lVar4 + 0x188))(0x100);
                dVar3 = (**(code **)(lVar4 + 0x800))();
                glu::checkError(dVar3,"Clear",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                                ,0xa56);
              }
              (**(code **)(lVar4 + 0x538))(0,0,1);
              dVar3 = (**(code **)(lVar4 + 0x800))();
              glu::checkError(dVar3,"DrawArrays",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                              ,0xa5a);
              iVar1 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])
                                (this,(texture *)&__dnew,&texture_1);
              if ((char)iVar1 == '\0') goto LAB_00dcf7a8;
              uVar2 = (int)uVar6 + 1;
              uVar6 = (ulong)uVar2;
            } while (local_308 != uVar2);
          }
        }
        else {
          (**(code **)(lVar4 + 0x1c0))(0,0,0,0);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"ClearColor",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                          ,0xa68);
          (**(code **)(lVar4 + 0x188))(0x4000);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"Clear",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                          ,0xa6b);
          iVar1 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])
                            (this,(texture *)&__dnew,&texture_1);
          if ((char)iVar1 == '\0') {
LAB_00dcf7a8:
            Utils::framebuffer::~framebuffer(&framebuffer);
            Utils::texture::~texture(&texture_1);
            Utils::texture::~texture((texture *)&__dnew);
            description = "Fail";
            __filename = &DAT_00000001;
            goto LAB_00dcf7d5;
          }
        }
        Utils::framebuffer::~framebuffer(&framebuffer);
        Utils::texture::~texture(&texture_1);
        Utils::texture::~texture((texture *)&__dnew);
        local_310 = local_310 + 1;
      } while (local_310 != local_304);
      __filename = (char *)0x0;
      description = "Pass";
LAB_00dcf7d5:
      tcu::TestContext::setTestResult
                (((this->super_TestCaseBase).m_context)->m_testCtx,(qpTestResult)__filename,
                 description);
      Utils::vertexArray::~vertexArray(&vao);
      Utils::program::remove(&program,__filename);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vertex._M_dataplus._M_p != &vertex.field_2) {
        operator_delete(vertex._M_dataplus._M_p,vertex.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)geometry._M_dataplus._M_p != &geometry.field_2) {
        operator_delete(geometry._M_dataplus._M_p,geometry.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fragment._M_dataplus._M_p != &fragment.field_2) {
        operator_delete(fragment._M_dataplus._M_p,fragment.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
      }
      if (local_228[0] != local_218) {
        operator_delete(local_228[0],local_218[0] + 1);
      }
      if (local_208[0] != local_1f8) {
        operator_delete(local_208[0],local_1f8[0] + 1);
      }
      return STOP;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0x9f6);
    ppuVar5 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar5,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult DrawTestBase::iterate()
{
	if (!m_is_viewport_array_supported)
	{
		throw tcu::NotSupportedError(VIEWPORT_ARRAY_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions&   gl			 = m_context.getRenderContext().getFunctions();
	const glu::ContextType& context_type = m_context.getRenderContext().getType();

	/* Test result */
	bool test_result = true;

	/* Get type of test */
	const TEST_TYPE test_type = getTestType();

	GLuint n_draw_calls = getDrawCallsNumber();
	GLuint n_iterations = 0;
	switch (test_type)
	{
	case VIEWPORT:
	case SCISSOR:
		n_iterations = 3;
		break;
	case DEPTHRANGE:
	case PROVOKING:
		n_iterations = 2;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	/* Get shader sources and specialize them */
	const std::string& frag = getFragmentShader();
	const std::string& geom = getGeometryShader();
	const std::string& vert = getVertexShader();

	const GLchar* frag_template = frag.c_str();
	const GLchar* geom_template = geom.c_str();
	const GLchar* vert_template = vert.c_str();

	std::string fragment = specializeShader(1, &frag_template);
	std::string geometry = specializeShader(1, &geom_template);
	std::string vertex   = specializeShader(1, &vert_template);

	/* Prepare program */
	Utils::program program(m_context);

	try
	{
		program.build(0 /* compute */, fragment.c_str(), geometry.c_str(), 0 /* tess ctrl */, 0 /* tess eval */,
					  vertex.c_str(), 0 /* varying names */, 0 /* n_varyings */);
	}
	catch (Utils::shaderCompilationException& exc)
	{
		/* Something wrong with compilation, test case failed */
		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Shader compilation failed. Error message: " << exc.m_error_message;

		Utils::program::printShaderSource(exc.m_shader_source.c_str(), message);

		message << tcu::TestLog::EndMessage;

		TCU_FAIL("Shader compilation failed");
	}
	catch (Utils::programLinkageException& exc)
	{
		/* Something wrong with linking, test case failed */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Program linking failed. Error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		TCU_FAIL("Program linking failed");
	}

	program.use();

	/* Prepare VAO */
	Utils::vertexArray vao(m_context);
	vao.generate();
	vao.bind();

	/* For each iteration from test type */
	for (GLuint i = 0; i < n_iterations; ++i)
	{
		/* Prepare textures */
		Utils::texture texture_0(m_context);
		Utils::texture texture_1(m_context);

		prepareTextures(texture_0, texture_1);

		/* Prepare framebuffer */
		Utils::framebuffer framebuffer(m_context);
		framebuffer.generate();
		setupFramebuffer(framebuffer, texture_0, texture_1);
		framebuffer.bind();

		/* Set up viewports */
		setupViewports(test_type, i);

		if (false == isClearTest())
		{
			/* For each draw call */
			for (GLuint draw_call = 0; draw_call < n_draw_calls; ++draw_call)
			{
				prepareUniforms(program, draw_call);

				bool	is_clear;
				GLfloat depth_value;

				getClearSettings(is_clear, draw_call, depth_value);

				if (true == is_clear)
				{
					if (glu::isContextTypeGLCore(context_type))
					{
						gl.clearDepth((GLdouble)depth_value);
					}
					else
					{
						gl.clearDepthf(depth_value);
					}
					GLU_EXPECT_NO_ERROR(gl.getError(), "ClearDepth");

					gl.clear(GL_DEPTH_BUFFER_BIT);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Clear");
				}

				gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

				bool result = checkResults(texture_0, texture_1, draw_call);

				if (false == result)
				{
					test_result = false;
					goto end;
				}
			}
		}
		else
		{
			gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ClearColor");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Clear");

			bool result = checkResults(texture_0, texture_1, 0);

			if (false == result)
			{
				test_result = false;
				goto end;
			}
		}
	}

end:
	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}